

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

int __thiscall ON_wString::Replace(ON_wString *this,wchar_t *token1,wchar_t *token2)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  wchar_t *pwVar9;
  ON_Internal_Empty_wString *pOVar10;
  ulong uVar11;
  ON_wString *this_00;
  wchar_t wVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  wchar_t wVar17;
  uint uVar18;
  ulong uVar19;
  int i;
  int len;
  ON_SimpleArray<int> n;
  int local_80;
  wchar_t local_7c;
  size_t local_78;
  size_t local_70;
  ON_wString *local_68;
  wchar_t local_5c;
  ON_SimpleArray<int> local_58;
  wchar_t *local_40;
  size_t local_38;
  
  iVar14 = 0;
  if ((token1 != (wchar_t *)0x0) && (*token1 != L'\0')) {
    pwVar9 = L"";
    if (token2 != (wchar_t *)0x0) {
      pwVar9 = token2;
    }
    sVar8 = wcslen(token1);
    wVar12 = (wchar_t)sVar8;
    if (L'\0' < wVar12) {
      local_78 = wcslen(pwVar9);
      pOVar10 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar10 = &empty_wstring;
      }
      wVar17 = (pOVar10->header).string_length;
      iVar14 = 0;
      if (wVar12 <= wVar17) {
        local_58._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00808cb8;
        local_58.m_a = (int *)0x0;
        local_58.m_count = 0;
        local_58.m_capacity = 0;
        local_5c = wVar17;
        local_40 = pwVar9;
        ON_SimpleArray<int>::SetCapacity(&local_58,0x20);
        pwVar9 = this->m_s;
        local_80 = 0;
        local_70 = sVar8;
        local_68 = this;
        do {
          iVar14 = local_80;
          iVar6 = wcsncmp(pwVar9,token1,(ulong)(uint)(wVar12 & 0x7fffffff));
          if (iVar6 == 0) {
            ON_SimpleArray<int>::Append(&local_58,&local_80);
            local_80 = local_80 + (int)local_70;
            pwVar9 = pwVar9 + (uint)(wVar12 & 0x7fffffff);
          }
          else {
            pwVar9 = pwVar9 + 1;
            local_80 = iVar14 + 1;
          }
          this_00 = local_68;
        } while (local_80 <= wVar17 - wVar12);
        iVar14 = local_58.m_count;
        uVar15 = local_58._16_8_ & 0xffffffff;
        iVar6 = (int)local_78;
        iVar16 = (int)local_70;
        local_7c = (iVar6 - iVar16) * local_58.m_count + wVar17;
        if (local_7c == L'\0') {
          Destroy(local_68);
        }
        else {
          CopyArray(local_68);
          wVar12 = wVar17;
          if (wVar17 < local_7c) {
            wVar12 = local_7c;
          }
          pwVar9 = ReserveArray(this_00,(long)wVar12);
          if (pwVar9 == (wchar_t *)0x0) {
            iVar14 = 0;
          }
          else {
            if (iVar16 < iVar6) {
              if (0 < iVar14) {
                uVar11 = 0;
                do {
                  local_58.m_a[uVar11] = local_58.m_a[uVar11] + (int)local_70;
                  uVar11 = uVar11 + 1;
                } while (uVar15 != uVar11);
                if (0 < iVar14) {
                  uVar11 = local_78 & 0xffffffff;
                  wVar12 = local_7c;
                  do {
                    uVar19 = (ulong)(uint)wVar17;
                    uVar13 = (ulong)(uint)wVar12;
                    wVar2 = local_58.m_a[uVar15 - 1];
                    pwVar9 = this_00->m_s;
                    if (wVar2 < wVar17) {
                      uVar13 = (ulong)wVar12;
                      uVar19 = (ulong)wVar17;
                      do {
                        lVar5 = uVar19 - 1;
                        uVar19 = uVar19 - 1;
                        pwVar9[uVar13 - 1] = pwVar9[lVar5];
                        uVar13 = uVar13 - 1;
                      } while ((long)wVar2 < (long)uVar19);
                    }
                    wVar12 = (int)uVar13 - (int)local_78;
                    wVar17 = (int)uVar19 - (int)local_70;
                    memcpy(pwVar9 + wVar12,local_40,uVar11 << 2);
                    bVar4 = 1 < (long)uVar15;
                    this_00 = local_68;
                    uVar15 = uVar15 - 1;
                  } while (bVar4);
                }
              }
            }
            else {
              uVar3 = *local_58.m_a;
              uVar11 = (ulong)uVar3;
              ON_SimpleArray<int>::Append(&local_58,&local_5c);
              if (0 < iVar14) {
                uVar7 = (uint)local_78;
                local_38 = (ulong)(uVar7 & 0x7fffffff) << 2;
                uVar13 = 0;
                uVar19 = (ulong)uVar3;
                do {
                  if (0 < (int)uVar7) {
                    memcpy(this_00->m_s + (int)uVar11,local_40,local_38);
                    uVar11 = (ulong)((int)uVar11 + uVar7);
                  }
                  uVar18 = (int)uVar19 + (int)local_70;
                  uVar19 = (ulong)uVar18;
                  uVar3 = local_58.m_a[uVar13 + 1];
                  if ((int)uVar18 < (int)uVar3) {
                    pwVar9 = this_00->m_s;
                    uVar11 = (ulong)(int)uVar11;
                    uVar19 = (ulong)(int)uVar18;
                    do {
                      pwVar1 = pwVar9 + uVar19;
                      uVar19 = uVar19 + 1;
                      pwVar9[uVar11] = *pwVar1;
                      uVar11 = uVar11 + 1;
                    } while ((long)uVar19 < (long)(int)uVar3);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 != uVar15);
              }
            }
            pwVar9 = this_00->m_s;
            pOVar10 = (ON_Internal_Empty_wString *)(pwVar9 + -3);
            if (pwVar9 == (wchar_t *)0x0) {
              pOVar10 = &empty_wstring;
            }
            (pOVar10->header).string_length = local_7c;
            pwVar9[local_7c] = L'\0';
          }
        }
        ON_SimpleArray<int>::~ON_SimpleArray(&local_58);
      }
    }
  }
  return iVar14;
}

Assistant:

int ON_wString::Replace( const wchar_t* token1, const wchar_t* token2 )
{
  int count = 0;

  if ( 0 != token1 && 0 != token1[0] )
  {
    if ( 0 == token2 )
      token2 = L"";
    const int len1 = (int)wcslen(token1);
    if ( len1 > 0 )
    {
      const int len2 = (int)wcslen(token2);
      int len = Length();
      if ( len >= len1 )
      {
        // in-place
        ON_SimpleArray<int> n(32);
        const wchar_t* s = m_s;
        int i;
        for ( i = 0; i <= len-len1; /*empty*/ )
        {
          if ( wcsncmp(s,token1,len1) )
          {
            s++;
            i++;
          }
          else
          {
            n.Append(i);
            i += len1;
            s += len1;
          }
        }

        count = n.Count();

        // reserve array space - must be done even when len2 <= len1
        // so that shared arrays are not corrupted.
        const int newlen = len + (count*(len2-len1));
        if ( 0 == newlen )
        {
          Destroy();
          return count;
        }

        CopyArray();

        // 24 August 2006 Dale Lear
        //    This used to say
        //       ReserveArray(newlen);
        //    but when newlen < len and the string had multiple
        //    references, the ReserveArray(newlen) call truncated
        //    the input array.
        if (nullptr == ReserveArray((newlen < len) ? len : newlen))
          return 0;

        int i0, i1, ni, j;

        if ( len2 > len1 )
        {
          // copy from back to front
          i1 = newlen;
          i0 = len;
          for ( ni =0; ni < count; ni++ )
            n[ni] = n[ni] + len1;
          for ( ni = count-1; ni >= 0; ni-- )
          {
            j = n[ni];
            while ( i0 > j )
            {
              i0--;
              i1--;
              m_s[i1] = m_s[i0];
            }
            i1 -= len2;
            i0 -= len1;
            memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
          }
        }
        else
        {
          // copy from front to back
          i0 = i1 = n[0];
          n.Append(len);
          for ( ni = 0; ni < count; ni++ )
          {
            if ( len2 > 0 )
            {
              memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
              i1 += len2;
            }
            i0 += len1;
            j = n[ni+1];
            while ( i0 < j )
            {
              m_s[i1++] = m_s[i0++];
            }
          }
        }
        Header()->string_length = newlen;
        m_s[newlen] = 0;
      }
    }
  }

  return count;
}